

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>
 __thiscall
Lib::
concatIters<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node**>>
          (Lib *this,
          VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>
          *i1)

{
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>
  local_10;
  
  local_10 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>
              )i1->_core;
  if (local_10._core !=
      (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**> *)
      0x0) {
    (local_10._core)->_refCnt = (local_10._core)->_refCnt + 1;
  }
  iterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node**>>
            (this,&local_10);
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>::
  ~VirtualIterator(&local_10);
  return (IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>_>
          )(VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Node_**>
            )this;
}

Assistant:

static auto concatIters(I1 i1) 
{ return iterTraits(std::move(i1)); }